

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program_types.cpp
# Opt level: O0

bool __thiscall Clasp::Asp::PrgBody::resetSupported(PrgBody *this)

{
  bool bVar1;
  weight_t wVar2;
  uint32 uVar3;
  int iVar4;
  uint uVar5;
  size_t *in_RCX;
  uchar *sig;
  EVP_PKEY_CTX *ctx;
  PrgBody *in_RDI;
  uchar *in_R8;
  size_t in_R9;
  uint32 x;
  PrgBody *in_stack_ffffffffffffffd8;
  byte local_19;
  Literal in_stack_fffffffffffffff0;
  
  wVar2 = bound(in_RDI);
  in_RDI->unsupp_ = wVar2;
  uVar3 = size(in_RDI);
  while( true ) {
    local_19 = 0;
    if (uVar3 != 0) {
      uVar3 = uVar3 - 1;
      ctx = (EVP_PKEY_CTX *)(ulong)uVar3;
      in_stack_fffffffffffffff0 = goal(in_stack_ffffffffffffffd8,0);
      iVar4 = Literal::sign((Literal *)&stack0xfffffffffffffff0,ctx,sig,in_RCX,in_R8,in_R9);
      local_19 = (byte)iVar4;
    }
    if ((local_19 & 1) == 0) break;
    wVar2 = weight((PrgBody *)CONCAT44(uVar3,in_stack_fffffffffffffff0.rep_),
                   (uint32)((ulong)in_RDI >> 0x20));
    uVar5 = in_RDI->unsupp_ - wVar2;
    in_RCX = (size_t *)(ulong)uVar5;
    in_RDI->unsupp_ = uVar5;
  }
  bVar1 = isSupported(in_RDI);
  return bVar1;
}

Assistant:

bool PrgBody::resetSupported() {
	unsupp_ = bound();
	for (uint32 x = size(); x && goal(--x).sign(); ) {
		unsupp_ -= weight(x);
	}
	return isSupported();
}